

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * __thiscall ghc::filesystem::path::root_name(path *__return_storage_ptr__,path *this)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  format fmt;
  string_type sStack_38;
  
  if ((((2 < (this->_path)._M_string_length) &&
       (pcVar1 = (this->_path)._M_dataplus._M_p, *pcVar1 == '/')) && (pcVar1[1] == '/')) &&
     ((pcVar1[2] != 0x2f && (iVar2 = isprint((int)pcVar1[2]), iVar2 != 0)))) {
    lVar3 = std::__cxx11::string::find_first_of((char *)this,0x17c735);
    if (lVar3 != -1) {
      std::__cxx11::string::substr((ulong)&sStack_38,(ulong)this);
      path(__return_storage_ptr__,&sStack_38,fmt);
      std::__cxx11::string::~string((string *)&sStack_38);
      return __return_storage_ptr__;
    }
    path<std::__cxx11::string,ghc::filesystem::path>
              (__return_storage_ptr__,&this->_path,auto_format);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_path)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_path).field_2;
  (__return_storage_ptr__->_path)._M_string_length = 0;
  (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::root_name() const
{
#ifdef GHC_OS_WINDOWS
    if (_path.length() >= 2 && std::toupper(static_cast<unsigned char>(_path[0])) >= 'A' && std::toupper(static_cast<unsigned char>(_path[0])) <= 'Z' && _path[1] == ':') {
        return path(_path.substr(0, 2));
    }
#endif
    if (_path.length() > 2 && _path[0] == '/' && _path[1] == '/' && _path[2] != '/' && std::isprint(_path[2])) {
        impl_string_type::size_type pos = _path.find_first_of("/\\", 3);
        if (pos == impl_string_type::npos) {
            return path(_path);
        }
        else {
            return path(_path.substr(0, pos));
        }
    }
    return path();
}